

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O2

Vec_Wec_t * Mop_ManCubeCount(Mop_Man_t *p)

{
  int i;
  Vec_Wec_t *p_00;
  word *pwVar1;
  int i_00;
  int Level;
  ulong uVar2;
  
  p_00 = Vec_WecStart(p->nOuts);
  for (i_00 = 0; i_00 < p->vCubes->nSize; i_00 = i_00 + 1) {
    i = Vec_IntEntry(p->vCubes,i_00);
    if (i != -1) {
      pwVar1 = Mop_ManCubeOut(p,i);
      uVar2 = 0;
      while (Level = (int)uVar2, Level < p->nOuts) {
        if ((pwVar1[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) != 0) {
          Vec_WecPush(p_00,Level,i);
        }
        uVar2 = (ulong)(Level + 1);
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Wec_t * Mop_ManCubeCount( Mop_Man_t * p )
{
    int i, k, iCube;
    Vec_Wec_t * vOuts = Vec_WecStart( p->nOuts );
    Vec_IntForEachEntry( p->vCubes, iCube, i )
    if ( iCube != -1 )
    {
        word * pCube = Mop_ManCubeOut( p, iCube );
        for ( k = 0; k < p->nOuts; k++ )
            if ( Abc_TtGetBit( pCube, k ) )
                Vec_WecPush( vOuts, k, iCube );
    }
    return vOuts;
}